

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

NodeInfo * TaprootBuilder::Combine(NodeInfo *__return_storage_ptr__,NodeInfo *a,NodeInfo *b)

{
  pointer pLVar1;
  iterator iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint256 *puVar6;
  base_blob<256U> *pbVar7;
  pointer pLVar8;
  vector<uint256,std::allocator<uint256>> *pvVar9;
  long in_FS_OFFSET;
  Span<const_unsigned_char> a_00;
  Span<const_unsigned_char> b_00;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->leaves).
  super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->leaves).
  super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar7 = &(__return_storage_ptr__->hash).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0x10] = '\0';
  (pbVar7->m_data)._M_elems[0x11] = '\0';
  (pbVar7->m_data)._M_elems[0x12] = '\0';
  (pbVar7->m_data)._M_elems[0x13] = '\0';
  (pbVar7->m_data)._M_elems[0x14] = '\0';
  (pbVar7->m_data)._M_elems[0x15] = '\0';
  (pbVar7->m_data)._M_elems[0x16] = '\0';
  (pbVar7->m_data)._M_elems[0x17] = '\0';
  pbVar7 = &(__return_storage_ptr__->hash).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0x18] = '\0';
  (pbVar7->m_data)._M_elems[0x19] = '\0';
  (pbVar7->m_data)._M_elems[0x1a] = '\0';
  (pbVar7->m_data)._M_elems[0x1b] = '\0';
  (pbVar7->m_data)._M_elems[0x1c] = '\0';
  (pbVar7->m_data)._M_elems[0x1d] = '\0';
  (pbVar7->m_data)._M_elems[0x1e] = '\0';
  (pbVar7->m_data)._M_elems[0x1f] = '\0';
  puVar6 = &__return_storage_ptr__->hash;
  (puVar6->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar6->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar6->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar6->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar6->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar6->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar6->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar6->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar7 = &(__return_storage_ptr__->hash).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[8] = '\0';
  (pbVar7->m_data)._M_elems[9] = '\0';
  (pbVar7->m_data)._M_elems[10] = '\0';
  (pbVar7->m_data)._M_elems[0xb] = '\0';
  (pbVar7->m_data)._M_elems[0xc] = '\0';
  (pbVar7->m_data)._M_elems[0xd] = '\0';
  (pbVar7->m_data)._M_elems[0xe] = '\0';
  (pbVar7->m_data)._M_elems[0xf] = '\0';
  (__return_storage_ptr__->leaves).
  super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar8 = (a->leaves).
           super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (a->leaves).
           super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pLVar8 != pLVar1) {
    pvVar9 = (vector<uint256,std::allocator<uint256>> *)&pLVar8->merkle_branch;
    do {
      iVar2._M_current = *(uint256 **)(pvVar9 + 8);
      if (iVar2._M_current == *(uint256 **)(pvVar9 + 0x10)) {
        std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                  (pvVar9,iVar2,&b->hash);
      }
      else {
        uVar3 = *(undefined8 *)(b->hash).super_base_blob<256U>.m_data._M_elems;
        uVar4 = *(undefined8 *)((b->hash).super_base_blob<256U>.m_data._M_elems + 8);
        uVar5 = *(undefined8 *)((b->hash).super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)(((iVar2._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)((b->hash).super_base_blob<256U>.m_data._M_elems + 0x10);
        *(undefined8 *)(((iVar2._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar5;
        *(undefined8 *)((iVar2._M_current)->super_base_blob<256U>).m_data._M_elems = uVar3;
        *(undefined8 *)(((iVar2._M_current)->super_base_blob<256U>).m_data._M_elems + 8) = uVar4;
        *(long *)(pvVar9 + 8) = *(long *)(pvVar9 + 8) + 0x20;
      }
      std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::
      emplace_back<TaprootBuilder::LeafInfo>
                (&__return_storage_ptr__->leaves,(LeafInfo *)(pvVar9 + -0x20));
      pLVar8 = (pointer)(pvVar9 + 0x18);
      pvVar9 = pvVar9 + 0x38;
    } while (pLVar8 != pLVar1);
  }
  pLVar8 = (b->leaves).
           super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (b->leaves).
           super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pLVar8 != pLVar1) {
    pvVar9 = (vector<uint256,std::allocator<uint256>> *)&pLVar8->merkle_branch;
    do {
      iVar2._M_current = *(uint256 **)(pvVar9 + 8);
      if (iVar2._M_current == *(uint256 **)(pvVar9 + 0x10)) {
        std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                  (pvVar9,iVar2,&a->hash);
      }
      else {
        uVar3 = *(undefined8 *)(a->hash).super_base_blob<256U>.m_data._M_elems;
        uVar4 = *(undefined8 *)((a->hash).super_base_blob<256U>.m_data._M_elems + 8);
        uVar5 = *(undefined8 *)((a->hash).super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)(((iVar2._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)((a->hash).super_base_blob<256U>.m_data._M_elems + 0x10);
        *(undefined8 *)(((iVar2._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar5;
        *(undefined8 *)((iVar2._M_current)->super_base_blob<256U>).m_data._M_elems = uVar3;
        *(undefined8 *)(((iVar2._M_current)->super_base_blob<256U>).m_data._M_elems + 8) = uVar4;
        *(long *)(pvVar9 + 8) = *(long *)(pvVar9 + 8) + 0x20;
      }
      std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::
      emplace_back<TaprootBuilder::LeafInfo>
                (&__return_storage_ptr__->leaves,(LeafInfo *)(pvVar9 + -0x20));
      pLVar8 = (pointer)(pvVar9 + 0x18);
      pvVar9 = pvVar9 + 0x38;
    } while (pLVar8 != pLVar1);
  }
  a_00.m_size = 0x20;
  a_00.m_data = (uchar *)a;
  b_00.m_size = 0x20;
  b_00.m_data = (uchar *)b;
  ComputeTapbranchHash(&local_58,a_00,b_00);
  *(undefined4 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_58.super_base_blob<256U>.m_data._M_elems._16_4_;
  *(undefined4 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 0x14) =
       local_58.super_base_blob<256U>.m_data._M_elems._20_4_;
  *(undefined4 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_58.super_base_blob<256U>.m_data._M_elems._24_4_;
  *(undefined4 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 0x1c) =
       local_58.super_base_blob<256U>.m_data._M_elems._28_4_;
  *(undefined4 *)(__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems =
       local_58.super_base_blob<256U>.m_data._M_elems._0_4_;
  *(undefined4 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 4) =
       local_58.super_base_blob<256U>.m_data._M_elems._4_4_;
  *(undefined4 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 8) =
       local_58.super_base_blob<256U>.m_data._M_elems._8_4_;
  *(undefined4 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 0xc) =
       local_58.super_base_blob<256U>.m_data._M_elems._12_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TaprootBuilder::NodeInfo TaprootBuilder::Combine(NodeInfo&& a, NodeInfo&& b)
{
    NodeInfo ret;
    /* Iterate over all tracked leaves in a, add b's hash to their Merkle branch, and move them to ret. */
    for (auto& leaf : a.leaves) {
        leaf.merkle_branch.push_back(b.hash);
        ret.leaves.emplace_back(std::move(leaf));
    }
    /* Iterate over all tracked leaves in b, add a's hash to their Merkle branch, and move them to ret. */
    for (auto& leaf : b.leaves) {
        leaf.merkle_branch.push_back(a.hash);
        ret.leaves.emplace_back(std::move(leaf));
    }
    ret.hash = ComputeTapbranchHash(a.hash, b.hash);
    return ret;
}